

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall
spdlog::details::registry::register_logger(registry *this,shared_ptr<spdlog::logger> *new_logger)

{
  shared_ptr<spdlog::logger> *in_RSI;
  shared_ptr<spdlog::logger> *in_RDI;
  registry *unaff_retaddr;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RSI,in_stack_ffffffffffffffa8);
  std::shared_ptr<spdlog::logger>::shared_ptr
            (in_RSI,(shared_ptr<spdlog::logger> *)in_stack_ffffffffffffffa8);
  register_logger_(unaff_retaddr,in_RDI);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x241a06);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x241a10);
  return;
}

Assistant:

SPDLOG_INLINE void registry::register_logger(std::shared_ptr<logger> new_logger) {
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    register_logger_(std::move(new_logger));
}